

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_function_expression.cpp
# Opt level: O0

bool __thiscall duckdb::BoundFunctionExpression::IsFoldable(BoundFunctionExpression *this)

{
  bool bVar1;
  uint uVar2;
  type pEVar3;
  long in_RDI;
  Expression *in_stack_00000010;
  Expression *expr;
  ListLambdaBindData *lambda_bind_data;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  bool local_1;
  
  if (*(long *)(in_RDI + 0x148) != 0) {
    unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::operator->
              ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
               CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
    FunctionData::Cast<duckdb::ListLambdaBindData>
              ((FunctionData *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
    bVar1 = ::std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)
                       0xd7bc09);
    if (bVar1) {
      pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
      uVar2 = (*(pEVar3->super_BaseExpression)._vptr_BaseExpression[0xc])();
      if ((uVar2 & 1) != 0) {
        return false;
      }
    }
  }
  if (*(char *)(in_RDI + 0x100) == '\x01') {
    local_1 = false;
  }
  else {
    local_1 = Expression::IsFoldable(in_stack_00000010);
  }
  return local_1;
}

Assistant:

bool BoundFunctionExpression::IsFoldable() const {
	// functions with side effects cannot be folded: they have to be executed once for every row
	if (function.bind_lambda) {
		// This is a lambda function
		D_ASSERT(bind_info);
		auto &lambda_bind_data = bind_info->Cast<ListLambdaBindData>();
		if (lambda_bind_data.lambda_expr) {
			auto &expr = *lambda_bind_data.lambda_expr;
			if (expr.IsVolatile()) {
				return false;
			}
		}
	}
	return function.stability == FunctionStability::VOLATILE ? false : Expression::IsFoldable();
}